

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

TRex * trex_compile(char *pattern,char **error,int flags)

{
  int iVar1;
  size_t sVar2;
  TRexNode *pTVar3;
  void *pvVar4;
  TRexMatch *pTVar5;
  int res;
  TRex *exp;
  int flags_local;
  char **error_local;
  char *pattern_local;
  
  pattern_local = (char *)malloc(0x60);
  ((TRex *)pattern_local)->_bol = (char *)0x0;
  ((TRex *)pattern_local)->_eol = (char *)0x0;
  ((TRex *)pattern_local)->_p = pattern;
  sVar2 = strlen(pattern);
  ((TRex *)pattern_local)->_nallocated = (int)sVar2;
  pTVar3 = (TRexNode *)malloc((long)((TRex *)pattern_local)->_nallocated << 4);
  ((TRex *)pattern_local)->_nodes = pTVar3;
  ((TRex *)pattern_local)->_nsize = 0;
  ((TRex *)pattern_local)->_matches = (TRexMatch *)0x0;
  ((TRex *)pattern_local)->_nsubexpr = 0;
  iVar1 = trex_newnode((TRex *)pattern_local,0x102);
  ((TRex *)pattern_local)->_first = iVar1;
  ((TRex *)pattern_local)->_error = error;
  pvVar4 = malloc(200);
  ((TRex *)pattern_local)->_jmpbuf = pvVar4;
  ((TRex *)pattern_local)->_flags = flags;
  iVar1 = _setjmp((__jmp_buf_tag *)((TRex *)pattern_local)->_jmpbuf);
  if (iVar1 == 0) {
    iVar1 = trex_list((TRex *)pattern_local);
    ((TRex *)pattern_local)->_nodes[((TRex *)pattern_local)->_first].left = iVar1;
    if (*((TRex *)pattern_local)->_p != '\0') {
      trex_error((TRex *)pattern_local,"unexpected character");
    }
    pTVar5 = (TRexMatch *)malloc((long)((TRex *)pattern_local)->_nsubexpr << 4);
    ((TRex *)pattern_local)->_matches = pTVar5;
    memset(((TRex *)pattern_local)->_matches,0,(long)((TRex *)pattern_local)->_nsubexpr << 4);
  }
  else {
    trex_free((TRex *)pattern_local);
    pattern_local = (char *)0x0;
  }
  return (TRex *)pattern_local;
}

Assistant:

TRex * trex_compile(const TRexChar * pattern, const TRexChar ** error, int flags) {
	TRex * exp = (TRex *)malloc(sizeof(TRex));
	exp->_eol = exp->_bol = NULL;
	exp->_p = pattern;
	exp->_nallocated = (int)scstrlen(pattern) * sizeof(TRexChar);
	exp->_nodes = (TRexNode *)malloc(exp->_nallocated * sizeof(TRexNode));
	exp->_nsize = 0;
	exp->_matches = 0;
	exp->_nsubexpr = 0;
	exp->_first = trex_newnode(exp, OP_EXPR);
	exp->_error = error;
	exp->_jmpbuf = malloc(sizeof(jmp_buf));
	exp->_flags = flags;

	if (setjmp(*((jmp_buf *)exp->_jmpbuf)) == 0) {
		int res = trex_list(exp);
		exp->_nodes[exp->_first].left = res;

		if (*exp->_p != '\0') {
			trex_error(exp, _SC("unexpected character"));
		}

#ifdef _DEBUG
		{
			int nsize, i;
			TRexNode * t;
			nsize = exp->_nsize;
			t = &exp->_nodes[0];
			scprintf(_SC("\n"));

			for (i = 0; i < nsize; i++) {
				if (exp->_nodes[i].type > MAX_CHAR) {
					scprintf(_SC("[%02d] %10s "), i, g_nnames[exp->_nodes[i].type - MAX_CHAR]);
				} else {
					scprintf(_SC("[%02d] %10c "), i, exp->_nodes[i].type);
				}

				scprintf(_SC("left %02d right %02d next %02d\n"), exp->_nodes[i].left, exp->_nodes[i].right, exp->_nodes[i].next);
			}

			scprintf(_SC("\n"));
		}
#endif
		exp->_matches = (TRexMatch *) malloc(exp->_nsubexpr * sizeof(TRexMatch));
		memset(exp->_matches, 0, exp->_nsubexpr * sizeof(TRexMatch));
	} else {
		trex_free(exp);
		return NULL;
	}

	return exp;
}